

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuTmpInsertFunc(sqlite3_context *pCtx,int nVal,sqlite3_value **apVal)

{
  int iVar1;
  void *pvVar2;
  int local_30;
  int local_2c;
  int i;
  int rc;
  sqlite3rbu *p;
  sqlite3_value **apVal_local;
  int nVal_local;
  sqlite3_context *pCtx_local;
  
  pvVar2 = sqlite3_user_data(pCtx);
  local_2c = 0;
  iVar1 = sqlite3_value_int(*apVal);
  if (iVar1 != 0) {
    *(long *)((long)pvVar2 + 0x118) =
         (long)*(int *)((long)pvVar2 + 0xc4) + *(long *)((long)pvVar2 + 0x118);
  }
  for (local_30 = 0; local_2c == 0 && local_30 < nVal; local_30 = local_30 + 1) {
    local_2c = sqlite3_bind_value(*(sqlite3_stmt **)((long)pvVar2 + 0xe8),local_30 + 1,
                                  apVal[local_30]);
  }
  if (local_2c == 0) {
    sqlite3_step(*(sqlite3_stmt **)((long)pvVar2 + 0xe8));
    local_2c = sqlite3_reset(*(sqlite3_stmt **)((long)pvVar2 + 0xe8));
  }
  if (local_2c != 0) {
    sqlite3_result_error_code(pCtx,local_2c);
  }
  return;
}

Assistant:

static void rbuTmpInsertFunc(
  sqlite3_context *pCtx, 
  int nVal,
  sqlite3_value **apVal
){
  sqlite3rbu *p = sqlite3_user_data(pCtx);
  int rc = SQLITE_OK;
  int i;

  assert( sqlite3_value_int(apVal[0])!=0
      || p->objiter.eType==RBU_PK_EXTERNAL 
      || p->objiter.eType==RBU_PK_NONE 
  );
  if( sqlite3_value_int(apVal[0])!=0 ){
    p->nPhaseOneStep += p->objiter.nIndex;
  }

  for(i=0; rc==SQLITE_OK && i<nVal; i++){
    rc = sqlite3_bind_value(p->objiter.pTmpInsert, i+1, apVal[i]);
  }
  if( rc==SQLITE_OK ){
    sqlite3_step(p->objiter.pTmpInsert);
    rc = sqlite3_reset(p->objiter.pTmpInsert);
  }

  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
  }
}